

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdout_to_file(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  uv_process_options_t *puVar6;
  int extraout_EDX;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  ulong unaff_RBP;
  long *plVar10;
  long *plVar11;
  undefined1 **ppuVar12;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  int64_t eval_b_1;
  int64_t eval_b_5;
  int64_t eval_b;
  uv_stdio_container_t stdio [2];
  uv_fs_t fs_req;
  undefined1 *puStack_f28;
  uv_process_options_t *puStack_f20;
  undefined8 uStack_f18;
  code *pcStack_f10;
  long lStack_f08;
  long lStack_f00;
  uv_process_options_t *puStack_ef8;
  long lStack_ee8;
  long lStack_ee0;
  uv_process_options_t *puStack_ed8;
  uv_process_options_t *puStack_ed0;
  long lStack_ec0;
  long lStack_eb8;
  undefined4 uStack_eac;
  uv_stdio_container_t uStack_ea8;
  undefined4 uStack_e98;
  undefined4 uStack_e90;
  undefined4 uStack_e88;
  undefined4 uStack_e80;
  undefined4 uStack_e78;
  undefined4 uStack_e70;
  undefined1 auStack_e68 [16];
  uv_process_options_t *puStack_e58;
  undefined8 uStack_e50;
  long lStack_e48;
  undefined1 auStack_e40 [208];
  code *pcStack_d70;
  long lStack_d68;
  long lStack_d60;
  uv_stdio_container_t uStack_d58;
  undefined4 uStack_d48;
  undefined4 uStack_d38;
  undefined4 uStack_d28;
  uv_process_options_t *puStack_d20;
  uv_process_options_t auStack_d10 [2];
  undefined1 *puStack_c28;
  anon_union_8_2_13e1ed65_for_data aStack_c20;
  code *pcStack_c18;
  undefined8 uStack_c08;
  code *pcStack_c00;
  long lStack_bf8;
  long lStack_bf0;
  char *pcStack_be8;
  undefined8 uStack_be0;
  char acStack_bd8 [32];
  uv_stdio_container_t uStack_bb8;
  undefined4 uStack_ba8;
  undefined1 *puStack_ba0;
  long alStack_b90 [25];
  undefined1 auStack_ac8 [232];
  undefined1 auStack_9e0 [232];
  char *pcStack_8f8;
  uv_process_options_t *puStack_8f0;
  code *pcStack_8e8;
  undefined8 uStack_8e0;
  long lStack_8d0;
  long lStack_8c8;
  undefined1 auStack_8c0 [16];
  uv_stdio_container_t uStack_8b0;
  undefined4 uStack_8a0;
  uint uStack_898;
  undefined4 uStack_890;
  uint uStack_888;
  uv_process_options_t uStack_878;
  uint uStack_820;
  char *pcStack_6b8;
  uv_process_options_t *puStack_6b0;
  undefined1 auStack_678 [16];
  uv_stdio_container_t uStack_668;
  undefined4 uStack_658;
  uint uStack_650;
  undefined4 uStack_648;
  uint uStack_640;
  uv_process_options_t uStack_638;
  int iStack_5e0;
  char *pcStack_478;
  uv_process_options_t *puStack_470;
  undefined1 auStack_440 [16];
  uv_stdio_container_t uStack_430;
  undefined4 uStack_420;
  uint uStack_418;
  undefined4 uStack_410;
  uint uStack_408;
  uv_process_options_t uStack_3f8;
  uint uStack_3a0;
  char *pcStack_238;
  uv_process_options_t *puStack_230;
  undefined8 local_228;
  long local_218;
  long local_210;
  undefined1 local_208 [16];
  uv_stdio_container_t local_1f8;
  undefined4 local_1e8;
  uint local_1e0;
  uv_process_options_t local_1d0;
  uint local_178;
  
  pcVar7 = "stdout_file";
  puStack_230 = (uv_process_options_t *)0x1bf11a;
  unlink("stdout_file");
  puStack_230 = (uv_process_options_t *)0x1bf12d;
  init_process_options("spawn_helper2",exit_cb);
  puStack_230 = (uv_process_options_t *)0x1bf14a;
  iVar1 = uv_fs_open(0,&local_1d0,"stdout_file",0x42,0x180,0);
  local_1f8._0_8_ = SEXT48(iVar1);
  local_208._0_8_ = 0;
  if (local_1f8._0_8_ == 0) {
    pcVar7 = (char *)(ulong)local_178;
    puStack_230 = (uv_process_options_t *)0x1bf177;
    uv_fs_req_cleanup();
    options.stdio = &local_1f8;
    unaff_R14 = &options;
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    local_1e8 = 2;
    local_1e0 = local_178;
    options.stdio_count = 2;
    puStack_230 = (uv_process_options_t *)0x1bf1a6;
    uVar4 = uv_default_loop();
    puStack_230 = (uv_process_options_t *)0x1bf1b8;
    iVar1 = uv_spawn(uVar4,&process,&options);
    local_208._0_8_ = SEXT48(iVar1);
    local_218 = 0;
    if (local_208._0_8_ != 0) goto LAB_001bf3b6;
    puStack_230 = (uv_process_options_t *)0x1bf1dd;
    uVar4 = uv_default_loop();
    puStack_230 = (uv_process_options_t *)0x1bf1e7;
    iVar1 = uv_run(uVar4,0);
    local_208._0_8_ = SEXT48(iVar1);
    local_218 = 0;
    if (local_208._0_8_ != 0) goto LAB_001bf3c5;
    local_208._0_8_ = 1;
    local_218 = (long)exit_cb_called;
    if (local_218 != 1) goto LAB_001bf3d4;
    local_208._0_8_ = 1;
    local_218 = (long)close_cb_called;
    if (local_218 != 1) goto LAB_001bf3e3;
    puStack_230 = (uv_process_options_t *)0x1bf262;
    local_208 = uv_buf_init(output,0x400);
    local_228 = 0;
    puStack_230 = (uv_process_options_t *)0x1bf28d;
    iVar1 = uv_fs_read(0,&local_1d0,local_178,local_208,1,0);
    local_218 = 0xc;
    local_210 = (long)iVar1;
    if (local_210 != 0xc) goto LAB_001bf3f2;
    unaff_R14 = &local_1d0;
    puStack_230 = (uv_process_options_t *)0x1bf2ba;
    uv_fs_req_cleanup(unaff_R14);
    puStack_230 = (uv_process_options_t *)0x1bf2c8;
    iVar1 = uv_fs_close(0,unaff_R14,pcVar7,0);
    local_218 = (long)iVar1;
    local_210 = 0;
    if (local_218 != 0) goto LAB_001bf401;
    puStack_230 = (uv_process_options_t *)0x1bf2f2;
    uv_fs_req_cleanup(&local_1d0);
    pcVar7 = output;
    puStack_230 = (uv_process_options_t *)0x1bf30a;
    printf("output is: %s",output);
    puStack_230 = (uv_process_options_t *)0x1bf319;
    iVar1 = strcmp("hello world\n",output);
    local_218 = (long)iVar1;
    local_210 = 0;
    if (local_218 != 0) goto LAB_001bf410;
    puStack_230 = (uv_process_options_t *)0x1bf345;
    unlink("stdout_file");
    puStack_230 = (uv_process_options_t *)0x1bf34a;
    pcVar7 = (char *)uv_default_loop();
    puStack_230 = (uv_process_options_t *)0x1bf35e;
    uv_walk(pcVar7,close_walk_cb,0);
    puStack_230 = (uv_process_options_t *)0x1bf368;
    uv_run(pcVar7,0);
    local_218 = 0;
    puStack_230 = (uv_process_options_t *)0x1bf376;
    uVar4 = uv_default_loop();
    puStack_230 = (uv_process_options_t *)0x1bf37e;
    iVar1 = uv_loop_close(uVar4);
    local_210 = (long)iVar1;
    if (local_218 == local_210) {
      puStack_230 = (uv_process_options_t *)0x1bf39a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_230 = (uv_process_options_t *)0x1bf3b6;
    run_test_spawn_stdout_to_file_cold_1();
LAB_001bf3b6:
    puStack_230 = (uv_process_options_t *)0x1bf3c5;
    run_test_spawn_stdout_to_file_cold_2();
LAB_001bf3c5:
    puStack_230 = (uv_process_options_t *)0x1bf3d4;
    run_test_spawn_stdout_to_file_cold_3();
LAB_001bf3d4:
    puStack_230 = (uv_process_options_t *)0x1bf3e3;
    run_test_spawn_stdout_to_file_cold_4();
LAB_001bf3e3:
    puStack_230 = (uv_process_options_t *)0x1bf3f2;
    run_test_spawn_stdout_to_file_cold_5();
LAB_001bf3f2:
    puStack_230 = (uv_process_options_t *)0x1bf401;
    run_test_spawn_stdout_to_file_cold_6();
LAB_001bf401:
    puStack_230 = (uv_process_options_t *)0x1bf410;
    run_test_spawn_stdout_to_file_cold_7();
LAB_001bf410:
    puStack_230 = (uv_process_options_t *)0x1bf41f;
    run_test_spawn_stdout_to_file_cold_8();
  }
  puStack_230 = (uv_process_options_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_9();
  pcVar8 = "stdout_file";
  pcStack_238 = pcVar7;
  puStack_230 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,&uStack_3f8,"stdout_file",0x42,0x180,0);
  uStack_430._0_8_ = SEXT48(iVar1);
  auStack_440._0_8_ = 0;
  if (uStack_430._0_8_ == 0) {
    pcVar8 = (char *)(ulong)uStack_3a0;
    uv_fs_req_cleanup();
    options.stdio = &uStack_430;
    unaff_R14 = &options;
    uStack_430._0_8_ = uStack_430._0_8_ & 0xffffffff00000000;
    uStack_420 = 2;
    uStack_418 = uStack_3a0;
    uStack_410 = 2;
    uStack_408 = uStack_3a0;
    options.stdio_count = 3;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_440._0_8_ = SEXT48(iVar1);
    if (auStack_440._0_8_ != 0) goto LAB_001bf6ed;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    auStack_440._0_8_ = SEXT48(iVar1);
    if (auStack_440._0_8_ != 0) goto LAB_001bf6fc;
    auStack_440._0_8_ = 1;
    if (exit_cb_called != 1) goto LAB_001bf70b;
    auStack_440._0_8_ = 1;
    if (close_cb_called != 1) goto LAB_001bf71a;
    auStack_440 = uv_buf_init(output,0x400);
    iVar1 = uv_fs_read(0,&uStack_3f8,pcVar8,auStack_440,1,0);
    if (iVar1 != 0x1b) goto LAB_001bf729;
    unaff_R14 = &uStack_3f8;
    uv_fs_req_cleanup(unaff_R14);
    iVar1 = uv_fs_close(0,unaff_R14,uStack_3a0,0);
    if (iVar1 != 0) goto LAB_001bf738;
    uv_fs_req_cleanup(&uStack_3f8);
    pcVar8 = output;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\nhello errworld\n",output);
    if (iVar1 != 0) goto LAB_001bf747;
    unlink("stdout_file");
    pcVar8 = (char *)uv_default_loop();
    uv_walk(pcVar8,close_walk_cb,0);
    uv_run(pcVar8,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_001bf6ed:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_001bf6fc:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_001bf70b:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_001bf71a:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_001bf729:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_001bf738:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
LAB_001bf747:
    run_test_spawn_stdout_and_stderr_to_file_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_9();
  pcVar7 = "stdout_file";
  pcStack_478 = pcVar8;
  puStack_470 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,&uStack_638,"stdout_file",0x42,0x180,0);
  uStack_668._0_8_ = SEXT48(iVar1);
  auStack_678._0_8_ = 0;
  if (uStack_668._0_8_ == 0) {
    uv_fs_req_cleanup();
    unaff_RBP = 2;
    uVar2 = dup2(iStack_5e0,2);
    pcVar7 = (char *)(ulong)uVar2;
    uStack_668._0_8_ = SEXT48((int)uVar2);
    auStack_678._0_8_ = -1;
    if (uStack_668._0_8_ == -1) goto LAB_001bfa54;
    options.stdio = &uStack_668;
    unaff_R14 = &options;
    uStack_668._4_4_ = (int)uVar2 >> 0x1f;
    uStack_668._0_8_ = (ulong)(uint)uStack_668._4_4_ << 0x20;
    uStack_658 = 2;
    uStack_648 = 2;
    options.stdio_count = 3;
    uStack_650 = uVar2;
    uStack_640 = uVar2;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_678._0_8_ = SEXT48(iVar1);
    if (auStack_678._0_8_ != 0) goto LAB_001bfa63;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    auStack_678._0_8_ = SEXT48(iVar1);
    if (auStack_678._0_8_ != 0) goto LAB_001bfa72;
    auStack_678._0_8_ = 1;
    if (exit_cb_called != 1) goto LAB_001bfa81;
    auStack_678._0_8_ = 1;
    if (close_cb_called != 1) goto LAB_001bfa90;
    auStack_678 = uv_buf_init(output,0x400);
    iVar1 = uv_fs_read(0,&uStack_638,pcVar7,auStack_678,1,0);
    if (iVar1 != 0x1b) goto LAB_001bfa9f;
    unaff_R14 = &uStack_638;
    uv_fs_req_cleanup(unaff_R14);
    iVar1 = uv_fs_close(0,unaff_R14,uVar2,0);
    if (iVar1 != 0) goto LAB_001bfaae;
    uv_fs_req_cleanup(&uStack_638);
    pcVar7 = output;
    printf("output is: %s",output);
    iVar1 = strcmp("hello world\nhello errworld\n",output);
    if (iVar1 != 0) goto LAB_001bfabd;
    unlink("stdout_file");
    pcVar7 = (char *)uv_default_loop();
    uv_walk(pcVar7,close_walk_cb,0);
    uv_run(pcVar7,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_001bfa54:
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_001bfa63:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_001bfa72:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_001bfa81:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_001bfa90:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_001bfa9f:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_001bfaae:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
LAB_001bfabd:
    run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_9();
  pcVar8 = "stdout_file";
  pcStack_8e8 = (code *)0x1bfaf7;
  pcStack_6b8 = pcVar7;
  puStack_6b0 = unaff_R14;
  unlink("stdout_file");
  pcStack_8e8 = (code *)0x1bfb03;
  unlink("stderr_file");
  pcStack_8e8 = (code *)0x1bfb16;
  init_process_options("spawn_helper6",exit_cb);
  pcStack_8e8 = (code *)0x1bfb33;
  iVar1 = uv_fs_open(0,&uStack_878,"stdout_file",0x42,0x180,0);
  uVar2 = uStack_820;
  uStack_8b0._0_8_ = SEXT48(iVar1);
  auStack_8c0._0_8_ = 0;
  if (uStack_8b0._0_8_ == 0) {
    pcVar8 = (char *)(ulong)uStack_820;
    pcStack_8e8 = (code *)0x1bfb60;
    uv_fs_req_cleanup();
    pcStack_8e8 = (code *)0x1bfb6c;
    uVar2 = dup2(uVar2,1);
    unaff_RBP = (ulong)uVar2;
    uStack_8b0._0_8_ = SEXT48((int)uVar2);
    auStack_8c0._0_8_ = -1;
    if (uStack_8b0._0_8_ == -1) goto LAB_001bff3f;
    pcStack_8e8 = (code *)0x1bfbaf;
    iVar1 = uv_fs_open(0,&uStack_878,"stderr_file",0x42,0x180,0);
    uStack_8b0._0_8_ = SEXT48(iVar1);
    auStack_8c0._0_8_ = 0;
    if (uStack_8b0._0_8_ != 0) goto LAB_001bff4e;
    pcStack_8e8 = (code *)0x1bfbdc;
    uv_fs_req_cleanup();
    unaff_R15 = 2;
    pcStack_8e8 = (code *)0x1bfbee;
    uVar3 = dup2(uStack_820,2);
    pcVar8 = (char *)(ulong)uVar3;
    uStack_8b0._0_8_ = SEXT48((int)uVar3);
    auStack_8c0._0_8_ = -1;
    if (uStack_8b0._0_8_ == -1) goto LAB_001bff5d;
    options.stdio = &uStack_8b0;
    unaff_R14 = &options;
    uStack_8b0._4_4_ = (int)uVar3 >> 0x1f;
    uStack_8b0._0_8_ = (ulong)(uint)uStack_8b0._4_4_ << 0x20;
    uStack_8a0 = 2;
    uStack_890 = 2;
    options.stdio_count = 3;
    pcStack_8e8 = (code *)0x1bfc46;
    uStack_898 = uVar3;
    uStack_888 = uVar2;
    uVar4 = uv_default_loop();
    pcStack_8e8 = (code *)0x1bfc58;
    iVar1 = uv_spawn(uVar4,&process,&options);
    auStack_8c0._0_8_ = SEXT48(iVar1);
    lStack_8d0 = 0;
    if (auStack_8c0._0_8_ != 0) goto LAB_001bff6c;
    pcStack_8e8 = (code *)0x1bfc7d;
    uVar4 = uv_default_loop();
    pcStack_8e8 = (code *)0x1bfc87;
    iVar1 = uv_run(uVar4,0);
    auStack_8c0._0_8_ = SEXT48(iVar1);
    lStack_8d0 = 0;
    if (auStack_8c0._0_8_ != 0) goto LAB_001bff7b;
    auStack_8c0._0_8_ = 1;
    lStack_8d0 = (long)exit_cb_called;
    if (lStack_8d0 != 1) goto LAB_001bff8a;
    auStack_8c0._0_8_ = 1;
    lStack_8d0 = (long)close_cb_called;
    if (lStack_8d0 != 1) goto LAB_001bff99;
    pcStack_8e8 = (code *)0x1bfd02;
    auStack_8c0 = uv_buf_init(output,0x400);
    uStack_8e0 = 0;
    pcStack_8e8 = (code *)0x1bfd2d;
    iVar1 = uv_fs_read(0,&uStack_878,uVar2,auStack_8c0,1,0);
    lStack_8d0 = (long)iVar1;
    lStack_8c8 = 0xf;
    pcVar7 = (char *)unaff_R14;
    if (lStack_8d0 < 0xf) goto LAB_001bffa8;
    pcVar7 = (char *)&uStack_878;
    pcStack_8e8 = (code *)0x1bfd5a;
    uv_fs_req_cleanup(pcVar7);
    pcStack_8e8 = (code *)0x1bfd68;
    iVar1 = uv_fs_close(0,pcVar7,unaff_RBP,0);
    lStack_8d0 = (long)iVar1;
    lStack_8c8 = 0;
    if (lStack_8d0 != 0) goto LAB_001bffb7;
    pcStack_8e8 = (code *)0x1bfd92;
    uv_fs_req_cleanup(&uStack_878);
    pcVar7 = output;
    pcStack_8e8 = (code *)0x1bfdaa;
    printf("output is: %s",output);
    pcStack_8e8 = (code *)0x1bfdbe;
    iVar1 = strncmp("hello errworld\n",output,0xf);
    lStack_8d0 = (long)iVar1;
    lStack_8c8 = 0;
    if (lStack_8d0 != 0) goto LAB_001bffc6;
    uStack_8e0 = 0;
    pcStack_8e8 = (code *)0x1bfe02;
    iVar1 = uv_fs_read(0,&uStack_878,uVar3,auStack_8c0,1,0);
    lStack_8d0 = (long)iVar1;
    lStack_8c8 = 0xc;
    if (lStack_8d0 < 0xc) goto LAB_001bffd5;
    pcVar7 = (char *)&uStack_878;
    pcStack_8e8 = (code *)0x1bfe2f;
    uv_fs_req_cleanup(pcVar7);
    pcStack_8e8 = (code *)0x1bfe3d;
    iVar1 = uv_fs_close(0,pcVar7,pcVar8,0);
    lStack_8d0 = (long)iVar1;
    lStack_8c8 = 0;
    if (lStack_8d0 != 0) goto LAB_001bffe4;
    pcStack_8e8 = (code *)0x1bfe67;
    uv_fs_req_cleanup(&uStack_878);
    pcVar8 = output;
    pcStack_8e8 = (code *)0x1bfe7f;
    printf("output is: %s",output);
    pcStack_8e8 = (code *)0x1bfe93;
    iVar1 = strncmp("hello world\n",output,0xc);
    lStack_8d0 = (long)iVar1;
    lStack_8c8 = 0;
    if (lStack_8d0 != 0) goto LAB_001bfff3;
    pcStack_8e8 = (code *)0x1bfebf;
    unlink("stdout_file");
    pcStack_8e8 = (code *)0x1bfecb;
    unlink("stderr_file");
    pcStack_8e8 = (code *)0x1bfed0;
    pcVar8 = (char *)uv_default_loop();
    pcStack_8e8 = (code *)0x1bfee4;
    uv_walk(pcVar8,close_walk_cb,0);
    pcStack_8e8 = (code *)0x1bfeee;
    uv_run(pcVar8,0);
    lStack_8d0 = 0;
    pcStack_8e8 = (code *)0x1bfefc;
    uVar4 = uv_default_loop();
    pcStack_8e8 = (code *)0x1bff04;
    iVar1 = uv_loop_close(uVar4);
    lStack_8c8 = (long)iVar1;
    if (lStack_8d0 == lStack_8c8) {
      pcStack_8e8 = (code *)0x1bff20;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_8e8 = (code *)0x1bff3f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bff3f:
    pcStack_8e8 = (code *)0x1bff4e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bff4e:
    pcStack_8e8 = (code *)0x1bff5d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bff5d:
    pcStack_8e8 = (code *)0x1bff6c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bff6c:
    pcStack_8e8 = (code *)0x1bff7b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bff7b:
    pcStack_8e8 = (code *)0x1bff8a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bff8a:
    pcStack_8e8 = (code *)0x1bff99;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bff99:
    pcStack_8e8 = (code *)0x1bffa8;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    pcVar7 = (char *)unaff_R14;
LAB_001bffa8:
    pcStack_8e8 = (code *)0x1bffb7;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bffb7:
    pcStack_8e8 = (code *)0x1bffc6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bffc6:
    pcStack_8e8 = (code *)0x1bffd5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bffd5:
    pcStack_8e8 = (code *)0x1bffe4;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bffe4:
    pcStack_8e8 = (code *)0x1bfff3;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bfff3:
    pcStack_8e8 = (code *)0x1c0002;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  pcStack_8e8 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar9 = (int)&lStack_bf8;
  builtin_strncpy(acStack_bd8,"hello-from-spawn_stdin",0x17);
  pcStack_c00 = (code *)0x1c004b;
  pcStack_8f8 = pcVar8;
  puStack_8f0 = (uv_process_options_t *)pcVar7;
  pcStack_8e8 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_c00 = (code *)0x1c0050;
  uVar4 = uv_default_loop();
  puVar5 = auStack_9e0;
  pcStack_c00 = (code *)0x1c0065;
  uv_pipe_init(uVar4,puVar5,0);
  pcStack_c00 = (code *)0x1c006a;
  uVar4 = uv_default_loop();
  pcStack_c00 = (code *)0x1c007f;
  uv_pipe_init(uVar4,(uv_stream_t *)auStack_ac8,0);
  options.stdio = &uStack_bb8;
  uStack_bb8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_ba8 = 0x21;
  options.stdio_count = 2;
  pcStack_c00 = (code *)0x1c00b6;
  uStack_bb8.data.stream = (uv_stream_t *)auStack_ac8;
  puStack_ba0 = puVar5;
  uVar4 = uv_default_loop();
  pcStack_c00 = (code *)0x1c00c8;
  iVar1 = uv_spawn(uVar4,&process,&options);
  alStack_b90[0] = (long)iVar1;
  pcStack_be8 = (char *)0x0;
  if (alStack_b90[0] == 0) {
    pcStack_be8 = acStack_bd8;
    uStack_be0 = 0x17;
    pcStack_c00 = (code *)0x1c011b;
    iVar1 = uv_write(alStack_b90,auStack_ac8,&pcStack_be8,1,write_cb);
    lStack_bf0 = (long)iVar1;
    lStack_bf8 = 0;
    if (lStack_bf0 != 0) goto LAB_001c0281;
    pcStack_c00 = (code *)0x1c0154;
    iVar1 = uv_read_start(auStack_9e0,on_alloc,on_read);
    lStack_bf0 = (long)iVar1;
    lStack_bf8 = 0;
    if (lStack_bf0 != 0) goto LAB_001c028e;
    pcStack_c00 = (code *)0x1c0177;
    uVar4 = uv_default_loop();
    pcStack_c00 = (code *)0x1c0181;
    iVar1 = uv_run(uVar4,0);
    lStack_bf0 = (long)iVar1;
    lStack_bf8 = 0;
    if (lStack_bf0 != 0) goto LAB_001c029b;
    lStack_bf0 = 1;
    lStack_bf8 = (long)exit_cb_called;
    if (lStack_bf8 != 1) goto LAB_001c02a8;
    lStack_bf0 = 3;
    lStack_bf8 = (long)close_cb_called;
    if (lStack_bf8 != 3) goto LAB_001c02b5;
    pcStack_c00 = (code *)0x1c01f6;
    iVar1 = strcmp(acStack_bd8,output);
    lStack_bf0 = (long)iVar1;
    lStack_bf8 = 0;
    if (lStack_bf0 != 0) goto LAB_001c02c2;
    pcStack_c00 = (code *)0x1c0219;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_c00 = (code *)0x1c022d;
    uv_walk(puVar5,close_walk_cb,0);
    pcStack_c00 = (code *)0x1c0237;
    uv_run(puVar5,0);
    lStack_bf0 = 0;
    pcStack_c00 = (code *)0x1c0245;
    uVar4 = uv_default_loop();
    pcStack_c00 = (code *)0x1c024d;
    iVar1 = uv_loop_close(uVar4);
    lStack_bf8 = (long)iVar1;
    if (lStack_bf0 == lStack_bf8) {
      pcStack_c00 = (code *)0x1c0263;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_c00 = (code *)0x1c0281;
    run_test_spawn_stdin_cold_1();
LAB_001c0281:
    pcStack_c00 = (code *)0x1c028e;
    run_test_spawn_stdin_cold_2();
LAB_001c028e:
    pcStack_c00 = (code *)0x1c029b;
    run_test_spawn_stdin_cold_3();
LAB_001c029b:
    pcStack_c00 = (code *)0x1c02a8;
    run_test_spawn_stdin_cold_4();
LAB_001c02a8:
    pcStack_c00 = (code *)0x1c02b5;
    run_test_spawn_stdin_cold_5();
LAB_001c02b5:
    pcStack_c00 = (code *)0x1c02c2;
    run_test_spawn_stdin_cold_6();
LAB_001c02c2:
    pcStack_c00 = (code *)0x1c02cf;
    run_test_spawn_stdin_cold_7();
  }
  plVar10 = &lStack_bf0;
  pcStack_c00 = write_cb;
  run_test_spawn_stdin_cold_8();
  pcStack_c00 = (code *)(long)iVar9;
  uStack_c08 = 0;
  if (pcStack_c00 == (code *)0x0) {
    iVar1 = uv_close(plVar10[0xb],close_cb);
    return iVar1;
  }
  pcStack_c18 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  pcStack_d70 = (code *)0x1c033e;
  puStack_c28 = puVar5;
  aStack_c20.stream = (uv_stream_t *)auStack_ac8;
  pcStack_c18 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_d70 = (code *)0x1c0343;
  uVar4 = uv_default_loop();
  puVar6 = auStack_d10;
  pcStack_d70 = (code *)0x1c0357;
  uv_pipe_init(uVar4,puVar6,0);
  options.stdio = &uStack_d58;
  uStack_d58.flags = UV_IGNORE;
  uStack_d48 = 0;
  uStack_d38 = 0;
  uStack_d28 = 0x21;
  options.stdio_count = 4;
  pcStack_d70 = (code *)0x1c038c;
  puStack_d20 = puVar6;
  uVar4 = uv_default_loop();
  pcStack_d70 = (code *)0x1c039e;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_d60 = (long)iVar1;
  lStack_d68 = 0;
  if (lStack_d60 == 0) {
    pcStack_d70 = (code *)0x1c03d4;
    iVar1 = uv_read_start(auStack_d10,on_alloc,on_read);
    lStack_d60 = (long)iVar1;
    lStack_d68 = 0;
    if (lStack_d60 != 0) goto LAB_001c0514;
    pcStack_d70 = (code *)0x1c03f7;
    uVar4 = uv_default_loop();
    pcStack_d70 = (code *)0x1c0401;
    iVar1 = uv_run(uVar4,0);
    lStack_d60 = (long)iVar1;
    lStack_d68 = 0;
    if (lStack_d60 != 0) goto LAB_001c0521;
    lStack_d60 = 1;
    lStack_d68 = (long)exit_cb_called;
    if (lStack_d68 != 1) goto LAB_001c052e;
    lStack_d60 = 2;
    lStack_d68 = (long)close_cb_called;
    if (lStack_d68 != 2) goto LAB_001c053b;
    pcStack_d70 = (code *)0x1c047d;
    printf("output from stdio[3] is: %s",output);
    pcStack_d70 = (code *)0x1c048c;
    iVar1 = strcmp("fourth stdio!\n",output);
    lStack_d60 = (long)iVar1;
    lStack_d68 = 0;
    puVar6 = (uv_process_options_t *)output;
    if (lStack_d60 != 0) goto LAB_001c0548;
    pcStack_d70 = (code *)0x1c04af;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    pcStack_d70 = (code *)0x1c04c3;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_d70 = (code *)0x1c04cd;
    uv_run(puVar6,0);
    lStack_d60 = 0;
    pcStack_d70 = (code *)0x1c04db;
    uVar4 = uv_default_loop();
    pcStack_d70 = (code *)0x1c04e3;
    iVar1 = uv_loop_close(uVar4);
    lStack_d68 = (long)iVar1;
    if (lStack_d60 == lStack_d68) {
      pcStack_d70 = (code *)0x1c04f9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_d70 = (code *)0x1c0514;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001c0514:
    pcStack_d70 = (code *)0x1c0521;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001c0521:
    pcStack_d70 = (code *)0x1c052e;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001c052e:
    pcStack_d70 = (code *)0x1c053b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001c053b:
    pcStack_d70 = (code *)0x1c0548;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001c0548:
    pcStack_d70 = (code *)0x1c0555;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_d70 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStack_e58 = (uv_process_options_t *)0x1c056e;
  uVar4 = uv_default_loop();
  puStack_e58 = (uv_process_options_t *)0x1c057b;
  iVar1 = uv_tcp_init(uVar4,auStack_e40);
  lStack_e48 = (long)iVar1;
  uStack_e50 = 0;
  if (lStack_e48 == 0) {
    puStack_e58 = (uv_process_options_t *)0x1c05a4;
    iVar1 = uv_tcp_open(auStack_e40,3);
    lStack_e48 = (long)iVar1;
    uStack_e50 = 0;
    if (lStack_e48 != 0) goto LAB_001c0603;
    puStack_e58 = (uv_process_options_t *)0x1c05cf;
    iVar1 = uv_listen(auStack_e40,0x1000,0);
    lStack_e48 = (long)iVar1;
    uStack_e50 = 0;
    if (lStack_e48 == 0) {
      return 1;
    }
  }
  else {
    puStack_e58 = (uv_process_options_t *)0x1c0603;
    spawn_tcp_server_helper_cold_1();
LAB_001c0603:
    puStack_e58 = (uv_process_options_t *)0x1c0610;
    spawn_tcp_server_helper_cold_2();
  }
  puStack_e58 = (uv_process_options_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStack_ed0 = (uv_process_options_t *)0x1c0635;
  puStack_e58 = puVar6;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStack_ed0 = (uv_process_options_t *)0x1c064b;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_e68);
  uStack_ea8._0_8_ = SEXT48(iVar1);
  lStack_ec0 = 0;
  if (uStack_ea8._0_8_ == 0) {
    puStack_ed0 = (uv_process_options_t *)0x1c0670;
    uVar4 = uv_default_loop();
    puStack_ed0 = (uv_process_options_t *)0x1c0684;
    iVar1 = uv_tcp_init_ex(uVar4,&tcp_server,2);
    uStack_ea8._0_8_ = SEXT48(iVar1);
    lStack_ec0 = 0;
    if (uStack_ea8._0_8_ != 0) goto LAB_001c0869;
    puStack_ed0 = (uv_process_options_t *)0x1c06b7;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_e68,0);
    uStack_ea8._0_8_ = SEXT48(iVar1);
    lStack_ec0 = 0;
    if (uStack_ea8._0_8_ != 0) goto LAB_001c0878;
    puStack_ed0 = (uv_process_options_t *)0x1c06e8;
    iVar1 = uv_fileno(&tcp_server,&uStack_eac);
    uStack_ea8._0_8_ = SEXT48(iVar1);
    lStack_ec0 = 0;
    if (uStack_ea8._0_8_ != 0) goto LAB_001c0887;
    options.stdio = &uStack_ea8;
    puVar6 = &options;
    uStack_ea8._4_4_ = iVar1 >> 0x1f;
    uStack_ea8.flags = 2;
    uStack_ea8.data.file = 0;
    uStack_e98 = 2;
    uStack_e90 = 1;
    uStack_e88 = 2;
    uStack_e80 = 2;
    uStack_e78 = 2;
    uStack_e70 = uStack_eac;
    options.stdio_count = 4;
    puStack_ed0 = (uv_process_options_t *)0x1c0752;
    uVar4 = uv_default_loop();
    puStack_ed0 = (uv_process_options_t *)0x1c0764;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_ec0 = (long)iVar1;
    lStack_eb8 = 0;
    if (lStack_ec0 != 0) goto LAB_001c0896;
    puStack_ed0 = (uv_process_options_t *)0x1c0789;
    uVar4 = uv_default_loop();
    puStack_ed0 = (uv_process_options_t *)0x1c0793;
    iVar1 = uv_run(uVar4,0);
    lStack_ec0 = (long)iVar1;
    lStack_eb8 = 0;
    if (lStack_ec0 != 0) goto LAB_001c08a5;
    lStack_ec0 = 1;
    lStack_eb8 = (long)exit_cb_called;
    if (lStack_eb8 != 1) goto LAB_001c08b4;
    lStack_ec0 = 1;
    lStack_eb8 = (long)close_cb_called;
    if (lStack_eb8 != 1) goto LAB_001c08c3;
    puStack_ed0 = (uv_process_options_t *)0x1c0802;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_ed0 = (uv_process_options_t *)0x1c0816;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_ed0 = (uv_process_options_t *)0x1c0820;
    uv_run(puVar6,0);
    lStack_ec0 = 0;
    puStack_ed0 = (uv_process_options_t *)0x1c082e;
    uVar4 = uv_default_loop();
    puStack_ed0 = (uv_process_options_t *)0x1c0836;
    iVar1 = uv_loop_close(uVar4);
    lStack_eb8 = (long)iVar1;
    if (lStack_ec0 == lStack_eb8) {
      puStack_ed0 = (uv_process_options_t *)0x1c0852;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_ed0 = (uv_process_options_t *)0x1c0869;
    run_test_spawn_tcp_server_cold_1();
LAB_001c0869:
    puStack_ed0 = (uv_process_options_t *)0x1c0878;
    run_test_spawn_tcp_server_cold_2();
LAB_001c0878:
    puStack_ed0 = (uv_process_options_t *)0x1c0887;
    run_test_spawn_tcp_server_cold_3();
LAB_001c0887:
    puStack_ed0 = (uv_process_options_t *)0x1c0896;
    run_test_spawn_tcp_server_cold_4();
LAB_001c0896:
    puStack_ed0 = (uv_process_options_t *)0x1c08a5;
    run_test_spawn_tcp_server_cold_5();
LAB_001c08a5:
    puStack_ed0 = (uv_process_options_t *)0x1c08b4;
    run_test_spawn_tcp_server_cold_6();
LAB_001c08b4:
    puStack_ed0 = (uv_process_options_t *)0x1c08c3;
    run_test_spawn_tcp_server_cold_7();
LAB_001c08c3:
    puStack_ed0 = (uv_process_options_t *)0x1c08d2;
    run_test_spawn_tcp_server_cold_8();
  }
  puStack_ed0 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStack_ed0 = &options;
  puStack_ef8 = (uv_process_options_t *)0x1c08fb;
  puStack_ed8 = puVar6;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar6 = &options;
  options.stdio_count = 0;
  puStack_ef8 = (uv_process_options_t *)0x1c091b;
  uVar4 = uv_default_loop();
  puStack_ef8 = (uv_process_options_t *)0x1c092d;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_ee0 = (long)iVar1;
  lStack_ee8 = 0;
  if (lStack_ee0 == 0) {
    puStack_ef8 = (uv_process_options_t *)0x1c094e;
    uVar4 = uv_default_loop();
    puStack_ef8 = (uv_process_options_t *)0x1c0958;
    iVar1 = uv_run(uVar4,0);
    lStack_ee0 = (long)iVar1;
    lStack_ee8 = 0;
    if (lStack_ee0 != 0) goto LAB_001c0a2c;
    lStack_ee0 = 1;
    lStack_ee8 = (long)exit_cb_called;
    if (lStack_ee8 != 1) goto LAB_001c0a3b;
    lStack_ee0 = 1;
    lStack_ee8 = (long)close_cb_called;
    if (lStack_ee8 != 1) goto LAB_001c0a4a;
    puStack_ef8 = (uv_process_options_t *)0x1c09c7;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_ef8 = (uv_process_options_t *)0x1c09db;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_ef8 = (uv_process_options_t *)0x1c09e5;
    uv_run(puVar6,0);
    lStack_ee0 = 0;
    puStack_ef8 = (uv_process_options_t *)0x1c09f3;
    uVar4 = uv_default_loop();
    puStack_ef8 = (uv_process_options_t *)0x1c09fb;
    iVar1 = uv_loop_close(uVar4);
    lStack_ee8 = (long)iVar1;
    if (lStack_ee0 == lStack_ee8) {
      puStack_ef8 = (uv_process_options_t *)0x1c0a13;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_ef8 = (uv_process_options_t *)0x1c0a2c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001c0a2c:
    puStack_ef8 = (uv_process_options_t *)0x1c0a3b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001c0a3b:
    puStack_ef8 = (uv_process_options_t *)0x1c0a4a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001c0a4a:
    puStack_ef8 = (uv_process_options_t *)0x1c0a59;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStack_ef8 = (uv_process_options_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  plVar10 = &lStack_f08;
  pcStack_f10 = (code *)0x1c0a80;
  puStack_ef8 = puVar6;
  init_process_options("spawn_helper4",kill_cb);
  pcStack_f10 = (code *)0x1c0a85;
  uVar4 = uv_default_loop();
  pcStack_f10 = (code *)0x1c0a9b;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_f00 = (long)iVar1;
  lStack_f08 = 0;
  if (lStack_f00 == 0) {
    pcStack_f10 = (code *)0x1c0abe;
    uVar4 = uv_default_loop();
    pcStack_f10 = (code *)0x1c0acd;
    iVar1 = uv_timer_init(uVar4,&timer);
    lStack_f00 = (long)iVar1;
    lStack_f08 = 0;
    if (lStack_f00 != 0) goto LAB_001c0bfa;
    pcStack_f10 = (code *)0x1c0b05;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    lStack_f00 = (long)iVar1;
    lStack_f08 = 0;
    if (lStack_f00 != 0) goto LAB_001c0c07;
    pcStack_f10 = (code *)0x1c0b28;
    uVar4 = uv_default_loop();
    pcStack_f10 = (code *)0x1c0b32;
    iVar1 = uv_run(uVar4,0);
    lStack_f00 = (long)iVar1;
    lStack_f08 = 0;
    if (lStack_f00 != 0) goto LAB_001c0c14;
    lStack_f00 = 1;
    lStack_f08 = (long)exit_cb_called;
    if (lStack_f08 != 1) goto LAB_001c0c21;
    lStack_f00 = 2;
    lStack_f08 = (long)close_cb_called;
    if (lStack_f08 != 2) goto LAB_001c0c2e;
    pcStack_f10 = (code *)0x1c0b9b;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    pcStack_f10 = (code *)0x1c0baf;
    uv_walk(puVar6,close_walk_cb,0);
    pcStack_f10 = (code *)0x1c0bb9;
    uv_run(puVar6,0);
    lStack_f00 = 0;
    pcStack_f10 = (code *)0x1c0bc7;
    uVar4 = uv_default_loop();
    pcStack_f10 = (code *)0x1c0bcf;
    iVar1 = uv_loop_close(uVar4);
    lStack_f08 = (long)iVar1;
    if (lStack_f00 == lStack_f08) {
      pcStack_f10 = (code *)0x1c0be5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_f10 = (code *)0x1c0bfa;
    run_test_spawn_and_kill_cold_1();
LAB_001c0bfa:
    pcStack_f10 = (code *)0x1c0c07;
    run_test_spawn_and_kill_cold_2();
LAB_001c0c07:
    pcStack_f10 = (code *)0x1c0c14;
    run_test_spawn_and_kill_cold_3();
LAB_001c0c14:
    pcStack_f10 = (code *)0x1c0c21;
    run_test_spawn_and_kill_cold_4();
LAB_001c0c21:
    pcStack_f10 = (code *)0x1c0c2e;
    run_test_spawn_and_kill_cold_5();
LAB_001c0c2e:
    pcStack_f10 = (code *)0x1c0c3b;
    run_test_spawn_and_kill_cold_6();
  }
  plVar11 = &lStack_f00;
  pcStack_f10 = kill_cb;
  run_test_spawn_and_kill_cold_7();
  pcStack_f10 = (code *)0x0;
  uStack_f18 = 0;
  puStack_f20 = puVar6;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  puStack_f28 = (undefined1 *)plVar10;
  if (plVar10 == (long *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001c0ce9;
    uv_close(plVar11,close_cb);
    puStack_f28 = (undefined1 *)(long)(int)plVar11[9];
    if (puStack_f28 != (undefined1 *)0x0) {
      iVar1 = uv_kill(puStack_f28,0);
      puStack_f28 = (undefined1 *)(long)iVar1;
      if (puStack_f28 == (undefined1 *)0xfffffffffffffffd) {
        return iVar1;
      }
      goto LAB_001c0cfb;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001c0ce9:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001c0cfb:
  ppuVar12 = &puStack_f28;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar1 = uv_close(ppuVar12,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_stdout_to_file) {
  int r;
  uv_os_fd_t file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[2];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper2", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", UV_FS_O_CREAT | UV_FS_O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = file;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT_EQ(12, r);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\n", output));

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}